

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::helper::
     heapsort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (iterator Td,iterator SA,value_type size)

{
  reference rhs;
  reference rhs_00;
  reference lhs;
  reference lhs_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  undefined4 extraout_var_01;
  pos_type pVar4;
  BitmapArray<long> *pBVar5;
  BitmapArray<long> *pBVar6;
  long size_00;
  iterator Td_00;
  iterator Td_01;
  iterator Td_02;
  pos_type in_stack_ffffffffffffff88;
  BitmapArray<long> *pBVar7;
  pos_type in_stack_ffffffffffffff98;
  value_reference local_50;
  value_reference local_40;
  
  pBVar6 = (BitmapArray<long> *)Td.pos_;
  Td_00.array_ = Td.array_;
  pVar4 = SA.pos_;
  pBVar5 = SA.array_;
  size_00 = size;
  pBVar7 = pBVar6;
  if ((size & 1U) == 0) {
    size_00 = size + -1;
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,size_00 / 2 + pVar4,size_00 % 2);
    local_40.pos_ = (long)&(pBVar6->super_Bitmap)._vptr_Bitmap + CONCAT44(extraout_var,iVar2);
    pBVar7 = pBVar6;
    local_40.array_ = Td_00.array_;
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5);
    local_50.pos_ = (long)&(pBVar6->super_Bitmap)._vptr_Bitmap + CONCAT44(extraout_var_00,iVar2);
    local_50.array_ = Td_00.array_;
    bVar1 = bitmap::BitmapArray<long>::value_reference::operator<(&local_40,&local_50);
    in_stack_ffffffffffffff98 = size;
    if (bVar1) {
      lhs.pos_ = size;
      lhs.array_ = pBVar7;
      rhs.pos_ = in_stack_ffffffffffffff88;
      rhs.array_ = (BitmapArray<long> *)0x10e8dd;
      bitmap::swap(lhs,rhs);
      in_stack_ffffffffffffff98 = size;
    }
  }
  lVar3 = size_00 / 2;
  while (0 < lVar3) {
    lVar3 = lVar3 + -1;
    Td_00.pos_ = (pos_type)pBVar7;
    fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
              (Td_00,SA,lVar3,size_00);
  }
  if ((size & 1U) == 0) {
    lhs_00.pos_ = in_stack_ffffffffffffff98;
    lhs_00.array_ = pBVar7;
    rhs_00.pos_ = in_stack_ffffffffffffff88;
    rhs_00.array_ = (BitmapArray<long> *)0x10e92f;
    bitmap::swap(lhs_00,rhs_00);
    Td_01.pos_ = (pos_type)pBVar7;
    Td_01.array_ = Td_00.array_;
    fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
              (Td_01,SA,0,size_00);
  }
  while (lVar3 = size_00 + -1, 1 < size_00) {
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar4);
    local_50.array_ = pBVar5;
    local_50.pos_ = pVar4;
    local_40.array_ = pBVar5;
    local_40.pos_ = pVar4 + lVar3;
    bitmap::BitmapArray<long>::value_reference::operator=(&local_50,&local_40);
    Td_02.pos_ = (pos_type)pBVar7;
    Td_02.array_ = Td_00.array_;
    fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
              (Td_02,SA,0,lVar3);
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar4 + lVar3,CONCAT44(extraout_var_01,iVar2));
    size_00 = lVar3;
  }
  return;
}

Assistant:

void heapsort(const StringIterator_type Td, SAIterator_type SA,
              typename std::iterator_traits<SAIterator_type>::value_type size) {
  typedef typename std::iterator_traits<SAIterator_type>::value_type pos_type;
  pos_type i, m;
  pos_type t;

  m = size;
  if ((size % 2) == 0) {
    m--;
    if (Td[SA[m / 2]] < Td[SA[m]]) {
      std::iter_swap(SA + m, SA + m / 2);
    }
  }

  for (i = m / 2 - 1; 0 <= i; --i) {
    fixdown(Td, SA, i, m);
  }

  if ((size % 2) == 0) {
    std::iter_swap(SA, SA + m);
    fixdown(Td, SA, pos_type(0), m);
  }

  for (i = m - 1; 0 < i; --i) {
    t = SA[0];
    SA[0] = SA[i];
    fixdown(Td, SA, pos_type(0), i);
    SA[i] = t;
  }
}